

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform.cpp
# Opt level: O0

Transform * phyr::Transform::translate(Vector3f *v)

{
  Transform *this;
  double *in_RSI;
  Transform *in_RDI;
  Mat4x4 mi;
  Mat4x4 m;
  Mat4x4 *invMat;
  Mat4x4 *mat;
  _Mat4x4 local_108;
  _Mat4x4 local_88;
  double *local_8;
  
  local_8 = in_RSI;
  _Mat4x4::_Mat4x4(&local_88,1.0,0.0,0.0,*in_RSI,0.0,1.0,0.0,in_RSI[1],0.0,0.0,1.0,in_RSI[2],0.0,0.0
                   ,0.0,1.0);
  this = (Transform *)((ulong)local_8[2] ^ 0x8000000000000000);
  invMat = (Mat4x4 *)0x0;
  mat = (Mat4x4 *)0x3ff0000000000000;
  _Mat4x4::_Mat4x4(&local_108,1.0,0.0,0.0,-*local_8,0.0,1.0,0.0,-local_8[1],0.0,0.0,1.0,(double)this
                   ,0.0,0.0,0.0,1.0);
  Transform(this,mat,invMat);
  return in_RDI;
}

Assistant:

Transform Transform::translate(const Vector3f& v) {
    Mat4x4 m =  Mat4x4(1, 0, 0,  v.x,
                       0, 1, 0,  v.y,
                       0, 0, 1,  v.z,
                       0, 0, 0,    1);
    Mat4x4 mi = Mat4x4(1, 0, 0, -v.x,
                       0, 1, 0, -v.y,
                       0, 0, 1, -v.z,
                       0, 0, 0,    1);
    return Transform(m, mi);
}